

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Observed_Join.cpp
# Opt level: O1

bool __thiscall
SRUP_MSG_OBSERVED_JOIN_REQ::observer_ID(SRUP_MSG_OBSERVED_JOIN_REQ *this,uint64_t *device_id)

{
  uint64_t *puVar1;
  
  (this->super_SRUP_MSG_SIMPLE).super_SRUP_MSG.m_is_serialized = false;
  if (this->m_observer_id != (uint64_t *)0x0) {
    operator_delete(this->m_observer_id);
  }
  puVar1 = (uint64_t *)operator_new(8);
  this->m_observer_id = puVar1;
  *puVar1 = *device_id;
  return true;
}

Assistant:

bool SRUP_MSG_OBSERVED_JOIN_REQ::observer_ID(const uint64_t* device_id)
{
    m_is_serialized = false;
    try
    {
        if (m_observer_id != nullptr)
            delete(m_observer_id);

        m_observer_id = new uint64_t;
        std::memcpy(m_observer_id, device_id, sizeof(uint64_t));
    }
    catch (...)
    {
        m_observer_id = nullptr;
        return false;
    }
    return true;
}